

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::TriggerPromiseReactions
              (JavascriptPromiseReactionList *reactions,bool isRejecting,Var resolution,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  JavascriptPromiseReaction *this;
  bool bVar2;
  undefined4 *puVar3;
  SListNodeBase<Memory::Recycler> **ppSVar4;
  Type *pTVar5;
  RecyclableObject *pRVar6;
  JavascriptPromiseReaction *local_68;
  JavascriptPromiseReaction *reaction;
  Iterator it;
  JavascriptLibrary *library;
  ScriptContext *scriptContext_local;
  Var resolution_local;
  bool isRejecting_local;
  JavascriptPromiseReactionList *reactions_local;
  SListNodeBase<Memory::Recycler> local_20;
  JavascriptPromiseReaction **local_18;
  bool local_9;
  
  it.current = (NodeBase *)ScriptContext::GetLibrary(scriptContext);
  if (reactions != (JavascriptPromiseReactionList *)0x0) {
    _reaction = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::
                GetIterator(&reactions->
                             super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>
                           );
    while( true ) {
      local_18 = &reaction;
      if (it.list ==
          (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this = reaction;
      SListNodeBase<Memory::Recycler>::Next(&local_20);
      ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                          ((WriteBarrierPtr *)&local_20);
      bVar2 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::IsHead
                        ((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>
                          *)this,*ppSVar4);
      if (!bVar2) {
        SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)&reactions_local);
        Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                  ((WriteBarrierPtr *)&reactions_local);
      }
      local_9 = !bVar2;
      if (!local_9) break;
      if (isRejecting) {
        pTVar5 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator
                 ::Data((Iterator *)&reaction);
        local_68 = pTVar5->rejectReaction;
      }
      else {
        pTVar5 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator
                 ::Data((Iterator *)&reaction);
        local_68 = pTVar5->resolveReaction;
      }
      EnqueuePromiseReactionTask(local_68,resolution,scriptContext);
    }
  }
  pRVar6 = JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)it.current);
  return pRVar6;
}

Assistant:

Var JavascriptPromise::TriggerPromiseReactions(JavascriptPromiseReactionList* reactions, bool isRejecting, Var resolution, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();

        if (reactions != nullptr)
        {
            JavascriptPromiseReactionList::Iterator it = reactions->GetIterator();
            while (it.Next())
            {
                JavascriptPromiseReaction* reaction;
                if (isRejecting)
                {
                    reaction = it.Data().rejectReaction;
                }
                else
                {
                    reaction = it.Data().resolveReaction;
                }

                EnqueuePromiseReactionTask(reaction, resolution, scriptContext);
            }
        }

        return library->GetUndefined();
    }